

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawDoubleSky4PalCommand::Execute(DrawDoubleSky4PalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  BYTE BVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  PalEntry PVar10;
  uint8_t *puVar11;
  int col_1;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  char cVar20;
  uint uVar21;
  uint uVar22;
  int col;
  long lVar23;
  byte bVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  uint8_t *source1 [4];
  uint8_t *source0 [4];
  uint local_ec [5];
  uint32_t local_d8 [8];
  uint32_t local_b8 [16];
  uint8_t *puStack_78;
  uint8_t output [4];
  int32_t frac [4];
  int32_t fracstep [4];
  
  puVar11 = (this->super_PalSkyCommand)._dest;
  uVar3 = (this->super_PalSkyCommand)._count;
  iVar27 = (this->super_PalSkyCommand)._pitch;
  frac._8_8_ = (this->super_PalSkyCommand)._source[0];
  puStack_78 = (this->super_PalSkyCommand)._source2[0];
  frac._0_8_ = (this->super_PalSkyCommand)._source2[3];
  iVar4 = (this->super_PalSkyCommand)._sourceheight[0];
  iVar16 = (this->super_PalSkyCommand)._sourceheight[1];
  uVar5 = (this->super_PalSkyCommand)._texturefrac[0];
  local_d8[0] = uVar5;
  local_d8[1] = (this->super_PalSkyCommand)._texturefrac[1];
  local_d8[2] = (this->super_PalSkyCommand)._texturefrac[2];
  local_d8[3] = (this->super_PalSkyCommand)._texturefrac[3];
  uVar6 = (this->super_PalSkyCommand)._iscale[0];
  local_b8[0] = uVar6;
  local_b8[1] = (this->super_PalSkyCommand)._iscale[1];
  local_b8[2] = (this->super_PalSkyCommand)._iscale[2];
  local_b8[3] = (this->super_PalSkyCommand)._iscale[3];
  uVar7 = *(uint *)&(this->super_PalSkyCommand).super_DrawerCommand.field_0xc;
  uVar8 = (this->super_PalSkyCommand).solid_bottom;
  bVar1 = RGB32k.All
          [(ulong)((uVar8 & 0xff) >> 3) + (ulong)(uVar8 >> 6 & 0x3e0) + (ulong)(uVar8 >> 9 & 0x7c00)
          ];
  uVar21 = (uint)bVar1;
  iVar15 = (this->super_PalSkyCommand).super_DrawerCommand._dest_y;
  bVar24 = RGB32k.All
           [(ulong)((uVar7 & 0xff) >> 3) +
            (ulong)(uVar7 >> 6 & 0x3e0) + (ulong)(uVar7 >> 9 & 0x7c00)];
  uVar18 = -((int)uVar5 / (int)uVar6);
  uVar25 = (int)(0x400000 - uVar5) / (int)uVar6;
  uVar22 = (int)(0x1c00000 - uVar5) / (int)uVar6;
  uVar26 = (int)(0x2000000 - uVar5) / (int)uVar6;
  if ((int)uVar3 <= (int)uVar18) {
    uVar18 = uVar3;
  }
  uVar12 = uVar3;
  if ((int)uVar25 < (int)uVar3) {
    uVar12 = uVar25;
  }
  uVar13 = uVar3;
  if ((int)uVar22 < (int)uVar3) {
    uVar13 = uVar22;
  }
  lVar23 = 0;
  if ((int)uVar22 < 1) {
    uVar13 = 0;
  }
  uVar22 = uVar3;
  if ((int)uVar26 < (int)uVar3) {
    uVar22 = uVar26;
  }
  uVar19 = thread->pass_start_y - iVar15;
  if ((int)uVar19 < 1) {
    uVar19 = 0;
  }
  iVar9 = thread->num_cores;
  iVar15 = (iVar9 - (int)((iVar15 + uVar19) - thread->core) % iVar9) % iVar9 + uVar19;
  do {
    local_d8[lVar23] = local_d8[lVar23] + local_b8[lVar23] * iVar15;
    local_b8[lVar23] = local_b8[lVar23] * iVar9;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  if ((int)uVar25 < 1) {
    uVar12 = 0;
  }
  if ((int)uVar26 < 1) {
    uVar22 = 0;
  }
  puVar17 = (uint *)(puVar11 + iVar15 * iVar27);
  lVar23 = (long)(iVar27 * iVar9);
  for (; iVar15 < (int)((int)uVar5 / (int)uVar6 >> 0x1f & uVar18); iVar15 = iVar15 + iVar9) {
    *puVar17 = (uint)bVar24 << 8 | (uint)bVar24 << 0x18 | (uint)bVar24 << 0x10 | (uint)bVar24;
    lVar14 = 0;
    do {
      local_d8[lVar14] = local_d8[lVar14] + local_b8[lVar14];
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    puVar17 = (uint *)((long)puVar17 + lVar23);
  }
  uVar18 = iVar16 - 1;
  for (; iVar15 < (int)uVar12; iVar15 = iVar15 + iVar9) {
    lVar14 = 0;
    do {
      uVar25 = local_d8[lVar14];
      uVar26 = (uVar25 >> 8 & 0xffff) * iVar4 >> 0x10;
      bVar24 = *(byte *)(*(long *)(frac + lVar14 * 2 + 2) + (ulong)uVar26);
      if (bVar24 == 0) {
        if (uVar18 <= uVar26) {
          uVar26 = uVar18;
        }
        bVar24 = *(byte *)(*(long *)(frac + lVar14 * 2 + -6) + (ulong)uVar26);
      }
      iVar27 = (int)uVar25 >> 0xe;
      if (0xff < (int)uVar25 >> 0xe) {
        iVar27 = 0x100;
      }
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      PVar10.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar24].field_0.d
      ;
      iVar16 = 0x100 - iVar27;
      BVar2 = RGB32k.All
              [(ulong)(iVar16 * (uVar7 & 0xff) + ((uint)PVar10.field_0 & 0xff) * iVar27 >> 0xb) +
               (ulong)(iVar16 * (uVar7 >> 8 & 0xff) + ((uint)PVar10.field_0 >> 8 & 0xff) * iVar27 >>
                       6 & 0xfe0) +
               (ulong)(iVar16 * (uVar7 >> 0x10 & 0xff) +
                       ((uint)PVar10.field_0 >> 0x10 & 0xff) * iVar27 >> 1 & 0x1fc00)];
      local_d8[lVar14] = uVar25 + local_b8[lVar14];
      *(byte *)((long)local_ec + lVar14) = bVar24;
      *(BYTE *)((long)local_ec + lVar14) = BVar2;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    *puVar17 = local_ec[0];
    puVar17 = (uint *)((long)puVar17 + lVar23);
  }
  for (; iVar15 < (int)uVar13; iVar15 = iVar15 + iVar9) {
    lVar14 = 0;
    do {
      uVar7 = local_d8[lVar14];
      uVar25 = (uVar7 >> 8 & 0xffff) * iVar4 >> 0x10;
      cVar20 = *(char *)(*(long *)(frac + lVar14 * 2 + 2) + (ulong)uVar25);
      if (cVar20 == '\0') {
        if (uVar18 <= uVar25) {
          uVar25 = uVar18;
        }
        cVar20 = *(char *)(*(long *)(frac + lVar14 * 2 + -6) + (ulong)uVar25);
      }
      uVar5 = local_b8[lVar14];
      *(char *)((long)local_ec + lVar14) = cVar20;
      local_d8[lVar14] = uVar7 + uVar5;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    *puVar17 = local_ec[0];
    puVar17 = (uint *)((long)puVar17 + lVar23);
  }
  for (; iVar15 < (int)uVar22; iVar15 = iVar15 + iVar9) {
    lVar14 = 0;
    do {
      uVar7 = local_d8[lVar14];
      uVar25 = (uVar7 >> 8 & 0xffff) * iVar4 >> 0x10;
      bVar24 = *(byte *)(*(long *)(frac + lVar14 * 2 + 2) + (ulong)uVar25);
      if (bVar24 == 0) {
        if (uVar18 <= uVar25) {
          uVar25 = uVar18;
        }
        bVar24 = *(byte *)(*(long *)(frac + lVar14 * 2 + -6) + (ulong)uVar25);
      }
      iVar27 = (int)(0x2000000 - uVar7) >> 0xe;
      if (0xff < iVar27) {
        iVar27 = 0x100;
      }
      if (iVar27 < 1) {
        iVar27 = 0;
      }
      PVar10.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)GPalette.BaseColors[bVar24].field_0.d
      ;
      iVar16 = 0x100 - iVar27;
      BVar2 = RGB32k.All
              [(ulong)(iVar16 * (uVar8 & 0xff) + ((uint)PVar10.field_0 & 0xff) * iVar27 >> 0xb) +
               (ulong)(iVar16 * (uVar8 >> 8 & 0xff) + ((uint)PVar10.field_0 >> 8 & 0xff) * iVar27 >>
                       6 & 0xfe0) +
               (ulong)(iVar16 * (uVar8 >> 0x10 & 0xff) +
                       ((uint)PVar10.field_0 >> 0x10 & 0xff) * iVar27 >> 1 & 0x1fc00)];
      local_d8[lVar14] = uVar7 + local_b8[lVar14];
      *(byte *)((long)local_ec + lVar14) = bVar24;
      *(BYTE *)((long)local_ec + lVar14) = BVar2;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 4);
    *puVar17 = local_ec[0];
    puVar17 = (uint *)((long)puVar17 + lVar23);
  }
  if (iVar15 < (int)uVar3) {
    do {
      *puVar17 = uVar21 << 8 | (uint)bVar1 << 0x10 | uVar21 << 0x18 | uVar21;
      puVar17 = (uint *)((long)puVar17 + lVar23);
      iVar15 = iVar15 + iVar9;
    } while (iVar15 < (int)uVar3);
  }
  return;
}

Assistant:

void DrawDoubleSky4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int pitch = _pitch;
		const uint8_t *source0[4] = { _source[0], _source[1], _source[2], _source[3] };
		const uint8_t *source1[4] = { _source2[0], _source2[1], _source2[2], _source2[3] };
		int textureheight0 = _sourceheight[0];
		uint32_t maxtextureheight1 = _sourceheight[1] - 1;
		const uint32_t *palette = (const uint32_t *)GPalette.BaseColors;
		int32_t frac[4] = { (int32_t)_texturefrac[0], (int32_t)_texturefrac[1], (int32_t)_texturefrac[2], (int32_t)_texturefrac[3] };
		int32_t fracstep[4] = { (int32_t)_iscale[0], (int32_t)_iscale[1], (int32_t)_iscale[2], (int32_t)_iscale[3] };
		uint8_t output[4];

		int start_fade = 2; // How fast it should fade out

		int solid_top_r = RPART(solid_top);
		int solid_top_g = GPART(solid_top);
		int solid_top_b = BPART(solid_top);
		int solid_bottom_r = RPART(solid_bottom);
		int solid_bottom_g = GPART(solid_bottom);
		int solid_bottom_b = BPART(solid_bottom);
		uint32_t solid_top_fill = RGB32k.RGB[(solid_top_r >> 3)][(solid_top_g >> 3)][(solid_top_b >> 3)];
		uint32_t solid_bottom_fill = RGB32k.RGB[(solid_bottom_r >> 3)][(solid_bottom_g >> 3)][(solid_bottom_b >> 3)];
		solid_top_fill = (solid_top_fill << 24) | (solid_top_fill << 16) | (solid_top_fill << 8) | solid_top_fill;
		solid_bottom_fill = (solid_bottom_fill << 24) | (solid_bottom_fill << 16) | (solid_bottom_fill << 8) | solid_bottom_fill;

		// Find bands for top solid color, top fade, center textured, bottom fade, bottom solid color:
		int fade_length = (1 << (24 - start_fade));
		int start_fadetop_y = (-frac[0]) / fracstep[0];
		int end_fadetop_y = (fade_length - frac[0]) / fracstep[0];
		int start_fadebottom_y = ((2 << 24) - fade_length - frac[0]) / fracstep[0];
		int end_fadebottom_y = ((2 << 24) - frac[0]) / fracstep[0];
		for (int col = 1; col < 4; col++)
		{
			start_fadetop_y = MIN(start_fadetop_y, (-frac[0]) / fracstep[0]);
			end_fadetop_y = MAX(end_fadetop_y, (fade_length - frac[0]) / fracstep[0]);
			start_fadebottom_y = MIN(start_fadebottom_y, ((2 << 24) - fade_length - frac[0]) / fracstep[0]);
			end_fadebottom_y = MAX(end_fadebottom_y, ((2 << 24) - frac[0]) / fracstep[0]);
		}
		start_fadetop_y = clamp(start_fadetop_y, 0, count);
		end_fadetop_y = clamp(end_fadetop_y, 0, count);
		start_fadebottom_y = clamp(start_fadebottom_y, 0, count);
		end_fadebottom_y = clamp(end_fadebottom_y, 0, count);

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int col = 0; col < 4; col++)
		{
			frac[col] += fracstep[col] * skipped;
			fracstep[col] *= thread->num_cores;
		}
		pitch *= thread->num_cores;
		int num_cores = thread->num_cores;
		int index = skipped;

		// Top solid color:
		while (index < start_fadetop_y)
		{
			*((uint32_t*)dest) = solid_top_fill;
			dest += pitch;
			for (int col = 0; col < 4; col++)
				frac[col] += fracstep[col];
			index += num_cores;
		}

		// Top fade:
		while (index < end_fadetop_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_top = MAX(MIN(frac[col] >> (16 - start_fade), 256), 0);
				int inv_alpha_top = 256 - alpha_top;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_top + solid_top_r * inv_alpha_top) >> 8;
				c_green = (c_green * alpha_top + solid_top_g * inv_alpha_top) >> 8;
				c_blue = (c_blue * alpha_top + solid_top_b * inv_alpha_top) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Textured center:
		while (index < start_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				frac[col] += fracstep[col];
			}

			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Fade bottom:
		while (index < end_fadebottom_y)
		{
			for (int col = 0; col < 4; col++)
			{
				uint32_t sample_index = (((((uint32_t)frac[col]) << 8) >> FRACBITS) * textureheight0) >> FRACBITS;
				uint8_t fg = source0[col][sample_index];
				if (fg == 0)
				{
					uint32_t sample_index2 = MIN(sample_index, maxtextureheight1);
					fg = source1[col][sample_index2];
				}
				output[col] = fg;

				uint32_t c = palette[fg];
				int alpha_bottom = MAX(MIN(((2 << 24) - frac[col]) >> (16 - start_fade), 256), 0);
				int inv_alpha_bottom = 256 - alpha_bottom;
				int c_red = RPART(c);
				int c_green = GPART(c);
				int c_blue = BPART(c);
				c_red = (c_red * alpha_bottom + solid_bottom_r * inv_alpha_bottom) >> 8;
				c_green = (c_green * alpha_bottom + solid_bottom_g * inv_alpha_bottom) >> 8;
				c_blue = (c_blue * alpha_bottom + solid_bottom_b * inv_alpha_bottom) >> 8;
				output[col] = RGB32k.RGB[(c_red >> 3)][(c_green >> 3)][(c_blue >> 3)];

				frac[col] += fracstep[col];
			}
			*((uint32_t*)dest) = *((uint32_t*)output);
			dest += pitch;
			index += num_cores;
		}

		// Bottom solid color:
		while (index < count)
		{
			*((uint32_t*)dest) = solid_bottom_fill;
			dest += pitch;
			index += num_cores;
		}
	}